

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTree::
climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
          (QGraphicsSceneBspTree *this,anon_class_8_1_898d2811 *visitor,QRectF *rect,int index)

{
  Node *pNVar1;
  int index_00;
  Type TVar2;
  Node *pNVar3;
  double dVar4;
  
  do {
    if ((this->nodes).d.size == 0) {
      return;
    }
    pNVar3 = (this->nodes).d.ptr;
    pNVar1 = pNVar3 + index;
    index_00 = index * 2 + 1;
    TVar2 = pNVar3[index].type;
    if (TVar2 == Horizontal) {
      if (rect->yp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->yp) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,visitor,rect,index_00);
        dVar4 = rect->yp + rect->h;
        goto LAB_005b1040;
      }
    }
    else {
      if (TVar2 != Vertical) {
        if (TVar2 != Leaf) {
          return;
        }
        QtPrivate::sequential_erase_with_copy<QList<QGraphicsItem*>,QGraphicsItem*>
                  ((this->leaves).d.ptr + (pNVar1->field_0).leafIndex,&visitor->item);
        return;
      }
      if (rect->xp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->xp) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,visitor,rect,index_00);
        dVar4 = rect->xp + rect->w;
LAB_005b1040:
        if (dVar4 < (pNVar1->field_0).offset) {
          return;
        }
      }
    }
    index = index * 2 + 2;
  } while( true );
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}